

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
::_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Index targetColumnIndex;
  Index sourceColumnIndex;
  ID_index IVar1;
  Pos_index PVar2;
  Pos_index PVar3;
  ID_index IVar4;
  Master_chain_matrix *pMVar5;
  Column *this_00;
  Column *this_01;
  bool hasSmallerBirth;
  Index pairedIndex2;
  Index pairedIndex1;
  Column *col2;
  Column *col1;
  Index columnIndex2_local;
  Index columnIndex1_local;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
  *this_local;
  
  pMVar5 = _matrix(this);
  this_00 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
            ::get_column(pMVar5,columnIndex1);
  pMVar5 = _matrix(this);
  this_01 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
            ::get_column(pMVar5,columnIndex2);
  targetColumnIndex =
       Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
       ::get_paired_chain_index(&this_00->super_Chain_column_option);
  sourceColumnIndex =
       Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
       ::get_paired_chain_index(&this_01->super_Chain_column_option);
  IVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
          ::get_pivot(this_00);
  PVar2 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
          ::birth(&this->super_type,IVar1);
  IVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
          ::get_pivot(this_01);
  PVar3 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
          ::birth(&this->super_type,IVar1);
  IVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
          ::get_pivot(this_00);
  IVar4 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
          ::get_pivot(this_01);
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
  ::swap_positions(&this->super_type,IVar1,IVar4);
  if (PVar2 < PVar3) {
    pMVar5 = _matrix(this);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
    ::add_to(pMVar5,targetColumnIndex,sourceColumnIndex);
    pMVar5 = _matrix(this);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
    ::add_to(pMVar5,columnIndex1,columnIndex2);
    IVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
            ::get_pivot(this_00);
    IVar4 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
            ::get_pivot(this_01);
    Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
    ::negative_transpose(&this->super_type,IVar1,IVar4);
    this_local._4_4_ = columnIndex1;
  }
  else {
    pMVar5 = _matrix(this);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
    ::add_to(pMVar5,sourceColumnIndex,targetColumnIndex);
    pMVar5 = _matrix(this);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
    ::add_to(pMVar5,columnIndex2,columnIndex1);
    this_local._4_4_ = columnIndex2;
  }
  return this_local._4_4_;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  Index pairedIndex1 = col1.get_paired_chain_index();
  Index pairedIndex2 = col2.get_paired_chain_index();

  bool hasSmallerBirth;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    hasSmallerBirth = (CP::birth(col1.get_pivot()) < CP::birth(col2.get_pivot()));
  } else {
    hasSmallerBirth = birthComp_(pairedIndex1, pairedIndex2);
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }

  if (hasSmallerBirth)
  {
    _matrix()->add_to(pairedIndex1, pairedIndex2);
    _matrix()->add_to(columnIndex1, columnIndex2);

    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::negative_transpose(col1.get_pivot(), col2.get_pivot());
    }

    return columnIndex1;
  }

  _matrix()->add_to(pairedIndex2, pairedIndex1);
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}